

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O2

REF_STATUS ref_face_create(REF_FACE *ref_face_ptr,REF_GRID ref_grid)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  REF_FACE ref_face;
  REF_INT *pRVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  REF_CELL *ppRVar10;
  undefined8 uStack_70;
  REF_INT nodes [4];
  
  ref_face = (REF_FACE)malloc(0x18);
  *ref_face_ptr = ref_face;
  if (ref_face == (REF_FACE)0x0) {
    pcVar9 = "malloc *ref_face_ptr of REF_FACE_STRUCT NULL";
    uStack_70 = 0x24;
  }
  else {
    ref_face->n = 0;
    ref_face->max = 10;
    pRVar4 = (REF_INT *)malloc(0xa0);
    ref_face->f2n = pRVar4;
    if (pRVar4 != (REF_INT *)0x0) {
      uVar3 = ref_adj_create(&ref_face->adj);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x2d
               ,"ref_face_create",(ulong)uVar3,"create adj");
        return uVar3;
      }
      if (ref_grid->twod == 0) {
        ppRVar10 = ref_grid->cell + 8;
        for (lVar5 = 8; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          pRVar1 = *ppRVar10;
          for (iVar6 = 0; iVar6 < pRVar1->max; iVar6 = iVar6 + 1) {
            if (pRVar1->c2n[(long)pRVar1->size_per * (long)iVar6] != -1) {
              lVar8 = 0;
              while (lVar8 < pRVar1->face_per) {
                pRVar4 = pRVar1->c2n;
                pRVar2 = pRVar1->f2n;
                for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
                  nodes[lVar7] = pRVar4[(long)pRVar1->size_per * (long)iVar6 +
                                        (long)pRVar2[(ulong)((uint)lVar8 & 0x3fffffff) * 4 + lVar7]]
                  ;
                }
                uVar3 = ref_face_add_uniquely(ref_face,nodes);
                lVar8 = lVar8 + 1;
                if (uVar3 != 0) {
                  uStack_70 = 0x41;
                  goto LAB_0020bb64;
                }
              }
            }
          }
          ppRVar10 = ref_grid->cell + lVar5 + 1;
        }
      }
      else {
        ppRVar10 = ref_grid->cell + 3;
        for (lVar5 = 3; lVar5 != 8; lVar5 = lVar5 + 1) {
          pRVar1 = *ppRVar10;
          for (iVar6 = 0; iVar6 < pRVar1->max; iVar6 = iVar6 + 1) {
            if (pRVar1->c2n[(long)pRVar1->size_per * (long)iVar6] != -1) {
              lVar8 = 0;
              while (lVar8 < pRVar1->face_per) {
                pRVar4 = pRVar1->c2n;
                pRVar2 = pRVar1->f2n;
                for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
                  nodes[lVar7] = pRVar4[(long)pRVar1->size_per * (long)iVar6 +
                                        (long)pRVar2[(ulong)((uint)lVar8 & 0x3fffffff) * 4 + lVar7]]
                  ;
                }
                uVar3 = ref_face_add_uniquely(ref_face,nodes);
                lVar8 = lVar8 + 1;
                if (uVar3 != 0) {
                  uStack_70 = 0x36;
LAB_0020bb64:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c"
                         ,uStack_70,"ref_face_create",(ulong)uVar3,"add face");
                  return uVar3;
                }
              }
            }
          }
          ppRVar10 = ref_grid->cell + lVar5 + 1;
        }
      }
      return 0;
    }
    pcVar9 = "malloc ref_face->f2n of REF_INT NULL";
    uStack_70 = 0x2b;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",uStack_70,
         "ref_face_create",pcVar9);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_face_create(REF_FACE *ref_face_ptr, REF_GRID ref_grid) {
  REF_FACE ref_face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_CELL ref_cell;

  ref_malloc(*ref_face_ptr, 1, REF_FACE_STRUCT);

  ref_face = *ref_face_ptr;

  ref_face_n(ref_face) = 0;
  ref_face_max(ref_face) = 10;

  ref_malloc(ref_face->f2n, 4 * ref_face_max(ref_face), REF_INT);

  RSS(ref_adj_create(&(ref_face_adj(ref_face))), "create adj");

  if (ref_grid_twod(ref_grid)) {
    each_ref_grid_2d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        each_ref_cell_cell_face(ref_cell, cell_face) {
          for (node = 0; node < 4; node++) {
            nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
          }
          RSS(ref_face_add_uniquely(ref_face, nodes), "add face");
        }
      }
    }
  } else {
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        each_ref_cell_cell_face(ref_cell, cell_face) {
          for (node = 0; node < 4; node++) {
            nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
          }
          RSS(ref_face_add_uniquely(ref_face, nodes), "add face");
        }
      }
    }
  }

  return REF_SUCCESS;
}